

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drm.c
# Opt level: O3

int demmt_drm_ioctl_post
              (uint32_t fd,uint32_t id,uint8_t dir,uint8_t nr,uint16_t size,mmt_buf *buf,
              uint64_t ret,uint64_t err,void *state,mmt_memory_dump *args,int argc)

{
  drm_nouveau_gem_new *g;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  FILE *pFVar16;
  int iVar17;
  mmt_buf *pmVar18;
  mmt_buf *pmVar19;
  gpu_object *pgVar20;
  mmt_buf *pmVar21;
  gpu_object *pgVar22;
  gpu_object *pgVar23;
  char *pcVar24;
  uint32_t uVar25;
  uint32_t cid;
  char *__format;
  char *pcVar26;
  char *pcVar27;
  uint64_t ptr;
  char *pcVar28;
  __u32 _Var29;
  ulong uVar30;
  gpu_object *pgVar31;
  long lVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  char *pcVar35;
  char *pcVar36;
  char *pcVar37;
  char *pcVar38;
  char *pcVar39;
  char *pcVar40;
  char *local_a8;
  
  pFVar16 = _stdout;
  iVar17 = indent_logs;
  g = (drm_nouveau_gem_new *)(buf + 1);
  if ((int)id < -0x3fbf9b60) {
    if ((int)id < -0x3fef9bbb) {
      if ((int)id < -0x3fef9bf5) {
        if (id == 0x80046402) {
          if (dump_decoded_ioctl_data == 0) {
            return 0;
          }
          local_a8 = colors->reset;
          pcVar27 = colors->rname;
          _Var29 = (g->info).handle;
          ret_err(ret,err);
          if (iVar17 != 0) {
            pcVar26 = "%64s%sDRM_IOCTL_GET_MAGIC%s, magic: 0x%08x%s\n";
            goto LAB_002495f1;
          }
          pcVar39 = "LOG: %sDRM_IOCTL_GET_MAGIC%s, magic: 0x%08x%s\n";
LAB_0024a095:
          fprintf(pFVar16,pcVar39,pcVar27,local_a8,(ulong)_Var29,ret_err::r);
        }
        else if (id == 0xc008640a) {
          if (dump_decoded_ioctl_data == 0) {
            return 0;
          }
          if (indent_logs == 0) {
            fprintf(_stdout,"LOG: %sDRM_IOCTL_GEM_FLINK%s, handle: 0x%x, name: 0x%x\n",colors->rname
                    ,colors->reset,(ulong)buf[1].len,(ulong)buf[2].len);
          }
          else {
            fprintf(_stdout,"%64s%sDRM_IOCTL_GEM_FLINK%s, handle: 0x%x, name: 0x%x\n"," ");
          }
        }
        else {
          if (id != 0xc0106407) goto LAB_0024981e;
          if (dump_decoded_ioctl_data == 0) {
            return 0;
          }
          if (indent_logs == 0) {
            fprintf(_stdout,
                    "LOG: %sDRM_IOCTL_SET_VERSION%s post, di_major: %2d, di_minor: %2d, dd_major: %2d, dd_minor: %2d\n"
                    ,colors->rname,colors->reset,(ulong)buf[1].len,(ulong)buf[2].len,
                    (ulong)buf[3].len,(ulong)buf[4].len);
          }
          else {
            fprintf(_stdout,
                    "%64s%sDRM_IOCTL_SET_VERSION%s post, di_major: %2d, di_minor: %2d, dd_major: %2d, dd_minor: %2d\n"
                    ," ");
          }
        }
      }
      else if (id == 0xc010640b) {
        if (dump_decoded_ioctl_data == 0) {
          return 0;
        }
        pcVar27 = colors->reset;
        pcVar39 = colors->rname;
        pcVar26 = colors->eval;
        pcVar37 = colors->num;
        uVar8 = buf[1].len;
        uVar9 = buf[2].len;
        uVar15 = *(undefined8 *)(buf + 3);
        ret_err(ret,err);
        if (iVar17 == 0) {
          fprintf(pFVar16,
                  "LOG: %sDRM_IOCTL_GEM_OPEN%s post, name: %s%d%s, handle: %s%d%s, size: %llu%s\n",
                  pcVar39,pcVar27,pcVar26,(ulong)uVar8,pcVar27,pcVar37,(ulong)uVar9,pcVar27,uVar15,
                  ret_err::r);
        }
        else {
          fprintf(pFVar16,
                  "%64s%sDRM_IOCTL_GEM_OPEN%s post, name: %s%d%s, handle: %s%d%s, size: %llu%s\n",
                  " ",pcVar39,pcVar27,pcVar26,(ulong)uVar8,pcVar27,pcVar37,(ulong)uVar9,pcVar27,
                  uVar15,ret_err::r);
        }
      }
      else {
        if (id != 0xc010640c) {
          if (id == 0xc0106440) {
            if (dump_decoded_ioctl_data != 0) {
              pcVar27 = colors->reset;
              uVar30 = *(ulong *)&g->info;
              if (indent_logs == 0) {
                if (uVar30 < 0xe) {
                  pcVar39 = nouveau_param_names[uVar30] + 0x11;
                }
                else {
                  pcVar39 = "???";
                }
                fprintf(_stdout,
                        "LOG: %sDRM_NOUVEAU_GETPARAM%s, param: %s%14s%s (0x%lx), value: %s0x%lx%s",
                        colors->rname,pcVar27,colors->eval,pcVar39,pcVar27,uVar30,colors->num,
                        *(undefined8 *)(buf + 3),pcVar27);
              }
              else {
                if (uVar30 < 0xe) {
                  pcVar39 = nouveau_param_names[uVar30] + 0x11;
                }
                else {
                  pcVar39 = "???";
                }
                fprintf(_stdout,
                        "%64s%sDRM_NOUVEAU_GETPARAM%s, param: %s%14s%s (0x%lx), value: %s0x%lx%s",
                        " ",colors->rname,pcVar27,colors->eval,pcVar39,pcVar27,uVar30,colors->num,
                        *(undefined8 *)(buf + 3),pcVar27);
              }
              if (((undefined1  [40])g->info & (undefined1  [40])0xfffffffffffffffe) ==
                  (undefined1  [40])0x8) {
                auVar33._0_8_ = (double)CONCAT44(0x43300000,(int)*(undefined8 *)(buf + 3));
                auVar33._8_4_ = (int)((ulong)*(undefined8 *)(buf + 3) >> 0x20);
                auVar33._12_4_ = 0x45300000;
                fprintf(_stdout," (%f MB)",
                        ((auVar33._8_8_ - 1.9342813113834067e+25) +
                        (auVar33._0_8_ - 4503599627370496.0)) * 9.5367431640625e-07);
                uVar30 = *(ulong *)(buf + 3);
                if (0x3fffffff < uVar30) {
                  auVar34._8_4_ = (int)(uVar30 >> 0x20);
                  auVar34._0_8_ = uVar30;
                  auVar34._12_4_ = 0x45300000;
                  fprintf(_stdout," (%f GB)",
                          ((auVar34._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar30) - 4503599627370496.0)) *
                          9.313225746154785e-10);
                }
              }
              pFVar16 = _stdout;
              ret_err(ret,err);
              fprintf(pFVar16,"%s\n",ret_err::r);
              if (mmt_sync_fd != -1) {
                fflush(_stdout);
              }
            }
            lVar32._0_4_ = (g->info).handle;
            lVar32._4_4_ = (g->info).domain;
            if (lVar32 == 0xb) {
              demmt_drm_ioctl_post::nouveau_chipset = buf[3].len;
              return 0;
            }
            return 0;
          }
          goto LAB_0024981e;
        }
        if (dump_decoded_ioctl_data == 0) {
          return 0;
        }
        pcVar27 = colors->rname;
        pcVar39 = colors->reset;
        pcVar26 = colors->iname;
        pcVar37 = colors->num;
        pcVar35 = *(char **)(buf + 1);
        pcVar38 = *(char **)(buf + 3);
        ret_err(ret,err);
        if (iVar17 == 0) {
          __format = "LOG: %sDRM_IOCTL_GET_CAP%s, capability: %s%llu%s, value: %s%llu%s%s\n";
          pcVar40 = ret_err::r;
          pcVar24 = pcVar39;
          pcVar28 = pcVar26;
          pcVar26 = pcVar35;
          pcVar35 = pcVar39;
          pcVar36 = pcVar37;
          pcVar37 = pcVar38;
          pcVar38 = pcVar39;
        }
        else {
          __format = "%64s%sDRM_IOCTL_GET_CAP%s, capability: %s%llu%s, value: %s%llu%s%s\n";
          pcVar24 = pcVar27;
          pcVar27 = " ";
          pcVar28 = pcVar39;
          pcVar36 = pcVar39;
          pcVar40 = pcVar39;
        }
        fprintf(pFVar16,__format,pcVar27,pcVar24,pcVar28,pcVar26,pcVar35,pcVar36,pcVar37,pcVar38,
                pcVar40);
      }
      goto joined_r0x00249d64;
    }
    if (-0x3fcf9b81 < (int)id) {
      if (id == 0xc0306480) {
        if (dump_decoded_ioctl_data != 0) {
          if (indent_logs == 0) {
            fprintf(_stdout,"LOG: %sDRM_NOUVEAU_GEM_NEW%s post, ",colors->rname,colors->reset);
          }
          else {
            fprintf(_stdout,"%64s%sDRM_NOUVEAU_GEM_NEW%s post, "," ");
          }
          dump_drm_nouveau_gem_new(g);
          pFVar16 = _stdout;
          ret_err(ret,err);
          fprintf(pFVar16,"%s\n",ret_err::r);
          if (mmt_sync_fd != -1) {
            fflush(_stdout);
          }
        }
        uVar25 = buf[0xb].len;
        cid = uVar25;
LAB_00249d2b:
        drm_nouveau_gem_new(fd,cid,uVar25,(drm_nouveau_gem_info *)g);
        return 0;
      }
      if (id == 0xc0406400) {
        if (dump_decoded_ioctl_data == 0) {
          return 0;
        }
        pcVar27 = colors->reset;
        pcVar39 = colors->rname;
        pcVar26 = colors->eval;
        uVar8 = buf[1].len;
        uVar9 = buf[2].len;
        uVar1 = buf[3].len;
        uVar15 = *(undefined8 *)(buf + 7);
        uVar10 = *(undefined8 *)(buf + 5);
        uVar11 = *(undefined8 *)(buf + 0xb);
        uVar12 = *(undefined8 *)(buf + 9);
        uVar13 = *(undefined8 *)(buf + 0xf);
        uVar14 = *(undefined8 *)(buf + 0xd);
        ret_err(ret,err);
        if (iVar17 == 0) {
          fprintf(pFVar16,
                  "LOG: %sDRM_IOCTL_VERSION64%s, version: %s%d.%d.%d%s, name_addr: 0x%lx, name_len: %lu, date_addr: 0x%lx, date_len: %lu, desc_addr: 0x%lx, desc_len: %lu%s\n"
                  ,pcVar39,pcVar27,pcVar26,(ulong)uVar8,(ulong)uVar9,(ulong)uVar1,pcVar27,uVar15,
                  uVar10,uVar11,uVar12,uVar13,uVar14,ret_err::r);
        }
        else {
          fprintf(pFVar16,
                  "%64s%sDRM_IOCTL_VERSION64%s, version: %s%d.%d.%d%s, name_addr: 0x%lx, name_len: %lu, date_addr: 0x%lx, date_len: %lu, desc_addr: 0x%lx, desc_len: %lu%s\n"
                  ," ",pcVar39,pcVar27,pcVar26,(ulong)uVar8,(ulong)uVar9,(ulong)uVar1,pcVar27,uVar15
                  ,uVar10,uVar11,uVar12,uVar13,uVar14,ret_err::r);
        }
        if (mmt_sync_fd != -1) {
          fflush(_stdout);
        }
        pmVar21 = find_ptr(*(uint64_t *)(buf + 7),args,argc);
        if (pmVar21 != (mmt_buf *)0x0) {
          dump_mmt_buf_as_text(pmVar21,"name");
        }
        pmVar21 = find_ptr(*(uint64_t *)(buf + 0xb),args,argc);
        if (pmVar21 != (mmt_buf *)0x0) {
          dump_mmt_buf_as_text(pmVar21,"date");
        }
        ptr = *(uint64_t *)(buf + 0xf);
        goto LAB_00249b96;
      }
      if (id == 0xc0406481) {
        pmVar21 = find_ptr(*(uint64_t *)(buf + 3),args,argc);
        pmVar18 = find_ptr(*(uint64_t *)(buf + 9),args,argc);
        pmVar19 = find_ptr(*(uint64_t *)(buf + 7),args,argc);
        pFVar16 = _stdout;
        iVar17 = indent_logs;
        if (dump_decoded_ioctl_data != 0) {
          pcVar27 = colors->reset;
          pcVar39 = colors->rname;
          pcVar26 = colors->num;
          uVar8 = buf[1].len;
          uVar9 = buf[2].len;
          uVar15 = *(undefined8 *)(buf + 3);
          uVar1 = buf[5].len;
          uVar10 = *(undefined8 *)(buf + 7);
          uVar2 = buf[6].len;
          uVar11 = *(undefined8 *)(buf + 9);
          uVar3 = buf[0xb].len;
          uVar4 = buf[0xc].len;
          uVar12 = *(undefined8 *)(buf + 0xd);
          uVar13 = *(undefined8 *)(buf + 0xf);
          ret_err(ret,err);
          if (iVar17 == 0) {
            fprintf(pFVar16,
                    "LOG: %sDRM_NOUVEAU_GEM_PUSHBUF%s post, channel: %d, nr_buffers: %s%d%s, buffers: 0x%lx, nr_relocs: %s%d%s, relocs: 0x%lx, nr_push: %s%d%s, push: 0x%lx, suffix0: 0x%x, suffix1: 0x%x, vram_available: %lu, gart_available: %lu%s\n"
                    ,pcVar39,pcVar27,(ulong)uVar8,pcVar26,(ulong)uVar9,pcVar27,uVar15,pcVar26,
                    (ulong)uVar1,pcVar27,uVar10,pcVar26,(ulong)uVar2,pcVar27,uVar11,(ulong)uVar3,
                    (ulong)uVar4,uVar12,uVar13,ret_err::r);
          }
          else {
            fprintf(pFVar16,
                    "%64s%sDRM_NOUVEAU_GEM_PUSHBUF%s post, channel: %d, nr_buffers: %s%d%s, buffers: 0x%lx, nr_relocs: %s%d%s, relocs: 0x%lx, nr_push: %s%d%s, push: 0x%lx, suffix0: 0x%x, suffix1: 0x%x, vram_available: %lu, gart_available: %lu%s\n"
                    ," ",pcVar39,pcVar27,(ulong)uVar8,pcVar26,(ulong)uVar9,pcVar27,uVar15,pcVar26,
                    (ulong)uVar1,pcVar27,uVar10,pcVar26,(ulong)uVar2,pcVar27,uVar11,(ulong)uVar3,
                    (ulong)uVar4,uVar12,uVar13,ret_err::r);
          }
          if (mmt_sync_fd != -1) {
            fflush(_stdout);
          }
        }
        if ((pmVar21 != (mmt_buf *)0x0 || pmVar18 != (mmt_buf *)0x0) || pmVar19 != (mmt_buf *)0x0) {
          demmt_nouveau_decode_gem_pushbuf_data
                    (buf[2].len,(drm_nouveau_gem_pushbuf_bo *)(pmVar21 + 1),buf[6].len,
                     (drm_nouveau_gem_pushbuf_push *)(pmVar18 + 1),buf[5].len,
                     (drm_nouveau_gem_pushbuf_reloc *)(pmVar19 + 1));
          return 0;
        }
        return 0;
      }
LAB_0024981e:
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG: %sunknown drm ioctl%s %x\n",colors->err,colors->reset,(ulong)nr);
      }
      else {
        fprintf(_stdout,"%64s%sunknown drm ioctl%s %x\n"," ",colors->err);
      }
      iVar17 = 1;
      goto joined_r0x0024a2bc;
    }
    if (id == 0xc0106445) {
      if (dump_decoded_ioctl_data != 0) {
        pcVar27 = colors->reset;
        pcVar39 = colors->rname;
        uVar25 = buf[1].len;
        uVar8 = buf[2].len;
        uVar9 = buf[3].len;
        uVar1 = buf[4].len;
        ret_err(ret,err);
        if (iVar17 == 0) {
          fprintf(pFVar16,
                  "LOG: %sDRM_NOUVEAU_NOTIFIEROBJ_ALLOC%s post, channel: %d, handle: 0x%0x, size: %d, offset: %d%s\n"
                  ,pcVar39,pcVar27,uVar25,(ulong)uVar8,(ulong)uVar9,(ulong)uVar1,ret_err::r);
        }
        else {
          fprintf(pFVar16,
                  "%64s%sDRM_NOUVEAU_NOTIFIEROBJ_ALLOC%s post, channel: %d, handle: 0x%0x, size: %d, offset: %d%s\n"
                  ," ",pcVar39,pcVar27,uVar25,(ulong)uVar8,(ulong)uVar9,(ulong)uVar1,ret_err::r);
        }
        if (mmt_sync_fd != -1) {
          fflush(_stdout);
        }
      }
      gpu_object_add(fd,buf[1].len,buf[1].len,buf[2].len,0);
      return 0;
    }
    if (id == 0xc0246400) {
      if (dump_decoded_ioctl_data == 0) {
        return 0;
      }
      pcVar27 = colors->reset;
      pcVar39 = colors->rname;
      pcVar26 = colors->eval;
      uVar8 = buf[1].len;
      uVar9 = buf[2].len;
      uVar1 = buf[3].len;
      uVar2 = buf[5].len;
      uVar3 = buf[4].len;
      uVar4 = buf[7].len;
      uVar5 = buf[6].len;
      uVar6 = buf[9].len;
      uVar7 = buf[8].len;
      ret_err(ret,err);
      if (iVar17 == 0) {
        fprintf(pFVar16,
                "LOG: %sDRM_IOCTL_VERSION32%s, version: %s%d.%d.%d%s, name_addr: 0x%x, name_len: %d, date_addr: 0x%x, date_len: %d, desc_addr: 0x%x, desc_len: %d%s\n"
                ,pcVar39,pcVar27,pcVar26,(ulong)uVar8,(ulong)uVar9,(ulong)uVar1,pcVar27,(ulong)uVar2
                ,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,ret_err::r);
      }
      else {
        fprintf(pFVar16,
                "%64s%sDRM_IOCTL_VERSION32%s, version: %s%d.%d.%d%s, name_addr: 0x%x, name_len: %d, date_addr: 0x%x, date_len: %d, desc_addr: 0x%x, desc_len: %d%s\n"
                ," ",pcVar39,pcVar27,pcVar26,(ulong)uVar8,(ulong)uVar9,(ulong)uVar1,pcVar27,
                (ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,
                ret_err::r);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
      pmVar21 = find_ptr((ulong)buf[5].len,args,argc);
      if (pmVar21 != (mmt_buf *)0x0) {
        dump_mmt_buf_as_text(pmVar21,"name");
      }
      pmVar21 = find_ptr((ulong)buf[7].len,args,argc);
      if (pmVar21 != (mmt_buf *)0x0) {
        dump_mmt_buf_as_text(pmVar21,"date");
      }
      ptr = (uint64_t)buf[9].len;
LAB_00249b96:
      pmVar21 = find_ptr(ptr,args,argc);
      if (pmVar21 != (mmt_buf *)0x0) {
        dump_mmt_buf_as_text(pmVar21,"desc");
        return 0;
      }
      return 0;
    }
    if (id != 0xc0286484) goto LAB_0024981e;
    if (dump_decoded_ioctl_data != 0) {
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG: %sDRM_NOUVEAU_GEM_INFO%s post, ",colors->rname,colors->reset);
      }
      else {
        fprintf(_stdout,"%64s%sDRM_NOUVEAU_GEM_INFO%s post, "," ");
      }
      dump_drm_nouveau_gem_info((drm_nouveau_gem_info *)g);
      pFVar16 = _stdout;
      ret_err(ret,err);
      fprintf(pFVar16,"%s\n",ret_err::r);
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    if (gpu_objects == (gpu_object *)0x0) {
LAB_00249e4f:
      pcVar27 = "ERROR: can\'t find matching device object%s\n";
    }
    else {
      pgVar22 = (gpu_object *)0x0;
      pgVar20 = gpu_objects;
      pgVar31 = (gpu_object *)0x0;
      do {
        pgVar23 = pgVar31;
        if (((pgVar20->class_ == 0x80) && (pgVar20->fd == fd)) &&
           (pgVar23 = gpu_object_find(pgVar20->cid,(g->info).handle), pgVar22 = pgVar20,
           pgVar31 != (gpu_object *)0x0 && pgVar23 != (gpu_object *)0x0)) {
          fprintf(_stdout,
                  "ERROR: can\'t uniquely determine object, assuming it\'s the first one%s\n","");
          if (mmt_sync_fd != -1) {
            fflush(_stdout);
          }
          goto LAB_0024a291;
        }
        pgVar20 = pgVar20->next;
        pgVar31 = pgVar23;
      } while (pgVar20 != (gpu_object *)0x0);
      if (pgVar22 == (gpu_object *)0x0) goto LAB_00249e4f;
      if (pgVar23 == (gpu_object *)0x0) {
        uVar25 = pgVar22->handle;
        cid = pgVar22->cid;
        goto LAB_00249d2b;
      }
LAB_0024a291:
      pcVar27 = "ERROR: FIXME: DRM_NOUVEAU_GEM_INFO on known object%s\n";
    }
    fprintf(_stdout,pcVar27,"");
  }
  else {
    if (0x40046482 < (int)id) {
      if ((int)id < 0x40086482) {
        if (id != 0x40046483) {
          if (id == 0x40086409) {
            if ((err != 0 || ret != 0) && (dump_decoded_ioctl_data != 0)) {
              pcVar27 = colors->reset;
              pcVar39 = colors->rname;
              uVar8 = (g->info).handle;
              ret_err(ret,err);
              if (iVar17 == 0) {
                fprintf(pFVar16,"LOG: %sDRM_IOCTL_GEM_CLOSE%s, handle: %d%s\n",pcVar39,pcVar27,
                        (ulong)uVar8,ret_err::r);
              }
              else {
                fprintf(pFVar16,"%64s%sDRM_IOCTL_GEM_CLOSE%s, handle: %d%s\n"," ",pcVar39,pcVar27,
                        (ulong)uVar8,ret_err::r);
              }
              if (mmt_sync_fd != -1) {
                fflush(_stdout);
              }
            }
            pgVar20 = gpu_object_find(0,(g->info).handle);
            if (pgVar20 != (gpu_object *)0x0) {
              gpu_object_destroy(pgVar20);
              return 0;
            }
            return 0;
          }
          if (id == 0x40086446) {
            if ((err != 0 || ret != 0) && (dump_decoded_ioctl_data != 0)) {
              pcVar27 = colors->reset;
              pcVar39 = colors->rname;
              uVar8 = buf[1].len;
              uVar9 = buf[2].len;
              ret_err(ret,err);
              if (iVar17 == 0) {
                fprintf(pFVar16,"LOG: %sDRM_NOUVEAU_GPUOBJ_FREE%s, channel: %d, handle: 0x%0x%s\n",
                        pcVar39,pcVar27,(ulong)uVar8,(ulong)uVar9,ret_err::r);
              }
              else {
                fprintf(pFVar16,"%64s%sDRM_NOUVEAU_GPUOBJ_FREE%s, channel: %d, handle: 0x%0x%s\n",
                        " ",pcVar39,pcVar27,(ulong)uVar8,(ulong)uVar9,ret_err::r);
              }
              if (mmt_sync_fd != -1) {
                fflush(_stdout);
              }
            }
            _Var29 = buf[1].len;
            uVar25 = buf[2].len;
LAB_0024a1c8:
            pgVar20 = gpu_object_find(_Var29,uVar25);
            gpu_object_destroy(pgVar20);
            return 0;
          }
          goto LAB_0024981e;
        }
        if (err == 0 && ret == 0) {
          return 0;
        }
        if (dump_decoded_ioctl_data == 0) {
          return 0;
        }
        local_a8 = colors->reset;
        pcVar27 = colors->rname;
        _Var29 = (g->info).handle;
        ret_err(ret,err);
        if (iVar17 == 0) {
          pcVar39 = "LOG: %sDRM_NOUVEAU_GEM_CPU_FINI%s, handle: %d%s\n";
          goto LAB_0024a095;
        }
        pcVar26 = "%64s%sDRM_NOUVEAU_GEM_CPU_FINI%s, handle: %d%s\n";
LAB_002495f1:
        pcVar39 = ret_err::r;
LAB_00249810:
        fprintf(pFVar16,pcVar26," ",pcVar27,local_a8,(ulong)_Var29,pcVar39);
      }
      else if (id == 0x40086482) {
        if (err == 0 && ret == 0) {
          return 0;
        }
        if (dump_decoded_ioctl_data == 0) {
          return 0;
        }
        local_a8 = colors->reset;
        pcVar27 = colors->rname;
        _Var29 = buf[1].len;
        pcVar39 = (char *)(ulong)buf[2].len;
        ret_err(ret,err);
        if (iVar17 != 0) {
          pcVar26 = "%64s%sDRM_NOUVEAU_GEM_CPU_PREP%s, handle: %d, flags: 0x%0x%s\n";
          goto LAB_00249810;
        }
        fprintf(pFVar16,"LOG: %sDRM_NOUVEAU_GEM_CPU_PREP%s, handle: %d, flags: 0x%0x%s\n",pcVar27,
                local_a8,_Var29,pcVar39,ret_err::r);
      }
      else {
        if (id == 0x400c6444) {
          if ((err != 0 || ret != 0) && (dump_decoded_ioctl_data != 0)) {
            pcVar27 = colors->reset;
            pcVar39 = colors->rname;
            pcVar26 = colors->num;
            uVar25 = buf[1].len;
            uVar8 = buf[2].len;
            pcVar37 = colors->eval;
            uVar9 = buf[3].len;
            ret_err(ret,err);
            if (iVar17 == 0) {
              fprintf(pFVar16,
                      "LOG: %sDRM_NOUVEAU_GROBJ_ALLOC%s, channel: %d, handle: %s0x%x%s, class: %s0x%x%s%s\n"
                      ,pcVar39,pcVar27,uVar25,pcVar26,(ulong)uVar8,pcVar27,pcVar37,(ulong)uVar9,
                      pcVar27,ret_err::r);
            }
            else {
              fprintf(pFVar16,
                      "%64s%sDRM_NOUVEAU_GROBJ_ALLOC%s, channel: %d, handle: %s0x%x%s, class: %s0x%x%s%s\n"
                      ," ",pcVar39,pcVar27,uVar25,pcVar26,(ulong)uVar8,pcVar27,pcVar37,(ulong)uVar9,
                      pcVar27,ret_err::r);
            }
            if (mmt_sync_fd != -1) {
              fflush(_stdout);
            }
          }
          pgVar20 = gpu_object_add(fd,buf[1].len,0xf1f0eeee,buf[2].len,buf[3].len);
          pushbuf_add_object(buf[2].len,buf[3].len,pgVar20);
          pushbuf_add_object_name(buf[2].len,buf[3].len,pgVar20);
          return 0;
        }
        if (id != 0x40106441) goto LAB_0024981e;
        if (err == 0 && ret == 0) {
          return 0;
        }
        if (dump_decoded_ioctl_data == 0) {
          return 0;
        }
        pcVar27 = colors->reset;
        pcVar39 = colors->rname;
        uVar30 = *(ulong *)&g->info;
        if (indent_logs == 0) {
          if (uVar30 < 0xe) {
            pcVar26 = nouveau_param_names[uVar30];
          }
          else {
            pcVar26 = "???";
          }
          uVar15 = *(undefined8 *)(buf + 3);
          ret_err(ret,err);
          fprintf(pFVar16,"LOG: %sDRM_NOUVEAU_SETPARAM%s, param: %s (0x%lx), value: 0x%lx%s\n",
                  pcVar39,pcVar27,pcVar26,uVar30,uVar15,ret_err::r);
        }
        else {
          if (uVar30 < 0xe) {
            pcVar26 = nouveau_param_names[uVar30];
          }
          else {
            pcVar26 = "???";
          }
          uVar15 = *(undefined8 *)(buf + 3);
          ret_err(ret,err);
          fprintf(pFVar16,"%64s%sDRM_NOUVEAU_SETPARAM%s, param: %s (0x%lx), value: 0x%lx%s\n"," ",
                  pcVar39,pcVar27,pcVar26,uVar30,uVar15,ret_err::r);
        }
      }
joined_r0x00249d64:
      iVar17 = 0;
      goto joined_r0x0024a2bc;
    }
    if ((int)id < 0x641f) {
      if (id == 0xc04064a0) {
        if (dump_decoded_ioctl_data == 0) {
          return 0;
        }
        if (indent_logs == 0) {
          fprintf(_stdout,
                  "LOG: %sDRM_IOCTL_MODE_GETRESOURCES%s post, fb_id_ptr: %p, crtc_id_ptr: %p, connector_id_ptr: %p, encoder_id_ptr: %p, count_fbs: %d, count_crtcs: %d, count_connectors: %d, count_encoders: %d, min_width: %d, max_width: %4d, min_height: %d, max_height: %4d\n"
                  ,colors->rname,colors->reset,*(undefined8 *)(buf + 1),*(undefined8 *)(buf + 3),
                  *(undefined8 *)(buf + 5),*(undefined8 *)(buf + 7),(ulong)buf[9].len,
                  (ulong)buf[10].len,(ulong)buf[0xb].len,(ulong)buf[0xc].len,(ulong)buf[0xd].len,
                  (ulong)buf[0xe].len,(ulong)buf[0xf].len,(ulong)buf[0x10].len);
        }
        else {
          fprintf(_stdout,
                  "%64s%sDRM_IOCTL_MODE_GETRESOURCES%s post, fb_id_ptr: %p, crtc_id_ptr: %p, connector_id_ptr: %p, encoder_id_ptr: %p, count_fbs: %d, count_crtcs: %d, count_connectors: %d, count_encoders: %d, min_width: %d, max_width: %4d, min_height: %d, max_height: %4d\n"
                  ," ");
        }
        goto joined_r0x00249d64;
      }
      if (id == 0xc0586442) {
        if (dump_decoded_ioctl_data != 0) {
          if (indent_logs == 0) {
            fprintf(_stdout,
                    "LOG: %sDRM_NOUVEAU_CHANNEL_ALLOC%s post, fb_ctxdma: 0x%0x, tt_ctxdma: 0x%0x, channel: %d, pushbuf_domains: "
                    ,colors->rname,colors->reset,(ulong)buf[1].len,(ulong)buf[2].len,
                    (ulong)buf[3].len);
          }
          else {
            fprintf(_stdout,
                    "%64s%sDRM_NOUVEAU_CHANNEL_ALLOC%s post, fb_ctxdma: 0x%0x, tt_ctxdma: 0x%0x, channel: %d, pushbuf_domains: "
                    ," ");
          }
          decode_domain(buf[4].len,10);
          fprintf(_stdout,", notifier: 0x%0x, nr_subchan: %d",(ulong)buf[5].len,(ulong)buf[0x16].len
                 );
          uVar30 = 0;
          do {
            if (buf[uVar30 * 2 + 6].len != 0 || buf[uVar30 * 2 + 7].len != 0) {
              fprintf(_stdout," subchan[%d]=<h:0x%0x, c:0x%0x>",uVar30 & 0xffffffff);
            }
            pFVar16 = _stdout;
            uVar30 = uVar30 + 1;
          } while (uVar30 != 8);
          ret_err(ret,err);
          fprintf(pFVar16,"%s\n",ret_err::r);
          if (mmt_sync_fd != -1) {
            fflush(_stdout);
          }
        }
        uVar25 = buf[3].len;
        pgVar20 = gpu_object_add(fd,uVar25,uVar25,uVar25,0x80);
        nvrm_device_set_chipset(pgVar20,demmt_drm_ioctl_post::nouveau_chipset);
        pgVar20 = gpu_object_add(fd,buf[3].len,buf[3].len,0xf1f0eeee,0x506f);
        get_fifo_state(pgVar20);
        return 0;
      }
      if (id != 0x641e) goto LAB_0024981e;
      if (dump_decoded_ioctl_data == 0) {
        return 0;
      }
      pcVar27 = colors->reset;
      pcVar39 = colors->rname;
      if (indent_logs == 0) {
        pcVar26 = "LOG: %sDRM_IOCTL_SET_MASTER%s\n";
        goto LAB_00249d79;
      }
      pcVar27 = "%64s%sDRM_IOCTL_SET_MASTER%s\n";
LAB_00249717:
      fprintf(_stdout,pcVar27," ");
    }
    else if (id == 0x641f) {
      if (dump_decoded_ioctl_data == 0) {
        return 0;
      }
      pcVar27 = colors->reset;
      pcVar39 = colors->rname;
      if (indent_logs != 0) {
        pcVar27 = "%64s%sDRM_IOCTL_DROP_MASTER%s\n";
        goto LAB_00249717;
      }
      pcVar26 = "LOG: %sDRM_IOCTL_DROP_MASTER%s\n";
LAB_00249d79:
      fprintf(_stdout,pcVar26,pcVar39,pcVar27);
    }
    else {
      if (id != 0x40046411) {
        if (id == 0x40046443) {
          if ((err != 0 || ret != 0) && (dump_decoded_ioctl_data != 0)) {
            pcVar27 = colors->reset;
            pcVar39 = colors->rname;
            uVar8 = (g->info).handle;
            ret_err(ret,err);
            if (iVar17 == 0) {
              fprintf(pFVar16,"LOG: %sDRM_NOUVEAU_CHANNEL_FREE%s, channel: %d%s\n",pcVar39,pcVar27,
                      (ulong)uVar8,ret_err::r);
            }
            else {
              fprintf(pFVar16,"%64s%sDRM_NOUVEAU_CHANNEL_FREE%s, channel: %d%s\n"," ",pcVar39,
                      pcVar27,(ulong)uVar8,ret_err::r);
            }
            if (mmt_sync_fd != -1) {
              fflush(_stdout);
            }
          }
          pgVar20 = gpu_object_find((g->info).handle,0xf1f0eeee);
          iVar17 = pgVar20->children_space;
          if (0 < iVar17) {
            lVar32 = 0;
            do {
              if (pgVar20->children_objects[lVar32] != (gpu_object *)0x0) {
                gpu_object_destroy(pgVar20->children_objects[lVar32]);
                iVar17 = pgVar20->children_space;
              }
              lVar32 = lVar32 + 1;
            } while (lVar32 < iVar17);
          }
          gpu_object_destroy(pgVar20);
          _Var29 = (g->info).handle;
          uVar25 = _Var29;
          goto LAB_0024a1c8;
        }
        goto LAB_0024981e;
      }
      if (dump_decoded_ioctl_data == 0) {
        return 0;
      }
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG: %sDRM_IOCTL_AUTH_MAGIC%s, magic: 0x%x\n",colors->rname,colors->reset,
                (ulong)(g->info).handle);
      }
      else {
        fprintf(_stdout,"%64s%sDRM_IOCTL_AUTH_MAGIC%s, magic: 0x%x\n"," ");
      }
    }
  }
  iVar17 = 0;
joined_r0x0024a2bc:
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  return iVar17;
}

Assistant:

int demmt_drm_ioctl_post(uint32_t fd, uint32_t id, uint8_t dir, uint8_t nr, uint16_t size,
		struct mmt_buf *buf, uint64_t ret, uint64_t err, void *state,
		struct mmt_memory_dump *args, int argc)
{
	static int nouveau_chipset; // hack

	void *ioctl_data = buf->data;

	int i;
	if (id == DRM_NOUVEAU_IOCTL_GETPARAM)
	{
		struct drm_nouveau_getparam *data = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_NOUVEAU_GETPARAM%s, param: %s%14s%s (0x%" PRIx64 "), value: %s0x%" PRIx64 "%s",
					colors->rname, colors->reset, colors->eval,
					data->param < ARRAY_SIZE(nouveau_param_names) ? nouveau_param_names[data->param] + 17 : "???",
					colors->reset, data->param, colors->num, data->value, colors->reset);
			switch (data->param)
			{
				case NOUVEAU_GETPARAM_FB_SIZE:
				case NOUVEAU_GETPARAM_AGP_SIZE:
					mmt_log_cont(" (%f MB)", ((double)data->value) / (1 << 20));
					if (data->value >> 30 > 0)
						mmt_log_cont(" (%f GB)", ((double)data->value) / (1 << 30));
					break;
				default:
					break;
			}
			mmt_log_cont("%s\n", ret_err(ret, err));
		}

		if (data->param == NOUVEAU_GETPARAM_CHIPSET_ID)
			nouveau_chipset = data->value;
	}
	else if (id == DRM_NOUVEAU_IOCTL_SETPARAM)
	{
		struct drm_nouveau_setparam *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_NOUVEAU_SETPARAM%s, param: %s (0x%" PRIx64 "), value: 0x%" PRIx64 "%s\n",
					colors->rname, colors->reset,
					data->param < ARRAY_SIZE(nouveau_param_names) ? nouveau_param_names[data->param] : "???",
					data->param, data->value, ret_err(ret, err));
	}
	else if (id == DRM_NOUVEAU_IOCTL_CHANNEL_ALLOC)
	{
		struct drm_nouveau_channel_alloc *data = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_NOUVEAU_CHANNEL_ALLOC%s post, fb_ctxdma: 0x%0x, tt_ctxdma: 0x%0x, channel: %d, pushbuf_domains: ",
					colors->rname, colors->reset, data->fb_ctxdma_handle,
					data->tt_ctxdma_handle, data->channel);

			decode_domain(data->pushbuf_domains, 10);

			mmt_log_cont(", notifier: 0x%0x, nr_subchan: %d", data->notifier_handle, data->nr_subchan);

			for (i = 0; i < 8; ++i)
				if (data->subchan[i].handle || data->subchan[i].grclass)
					mmt_log_cont(" subchan[%d]=<h:0x%0x, c:0x%0x>", i, data->subchan[i].handle, data->subchan[i].grclass);

			mmt_log_cont("%s\n", ret_err(ret, err));
		}

		// hack, fake device
		struct gpu_object *dev = gpu_object_add(fd, data->channel, data->channel, data->channel, NVRM_DEVICE_0);
		nvrm_device_set_chipset(dev, nouveau_chipset);

		// hack, fake fifo
		struct gpu_object *fifo = gpu_object_add(fd, data->channel, data->channel, 0xf1f0eeee, NVRM_FIFO_IB_G80);
		get_fifo_state(fifo);
	}
	else if (id == DRM_NOUVEAU_IOCTL_CHANNEL_FREE)
	{
		struct drm_nouveau_channel_free *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_NOUVEAU_CHANNEL_FREE%s, channel: %d%s\n", colors->rname,
					colors->reset, data->channel, ret_err(ret, err));

		struct gpu_object *fifo = gpu_object_find(data->channel, 0xf1f0eeee);
		int i;
		for (i = 0; i < fifo->children_space; ++i)
			if (fifo->children_objects[i])
				gpu_object_destroy(fifo->children_objects[i]);
		gpu_object_destroy(fifo);
		gpu_object_destroy(gpu_object_find(data->channel, data->channel));
	}
	else if (id == DRM_NOUVEAU_IOCTL_GROBJ_ALLOC)
	{
		struct drm_nouveau_grobj_alloc *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_NOUVEAU_GROBJ_ALLOC%s, channel: %d, handle: %s0x%x%s, class: %s0x%x%s%s\n",
					colors->rname, colors->reset, data->channel, colors->num,
					data->handle, colors->reset, colors->eval, data->class,
					colors->reset, ret_err(ret, err));

		struct gpu_object *gpu_obj = gpu_object_add(fd, data->channel, 0xf1f0eeee, data->handle, data->class);
		pushbuf_add_object(data->handle, data->class, gpu_obj);
		pushbuf_add_object_name(data->handle, data->class, gpu_obj);
	}
	else if (id == DRM_NOUVEAU_IOCTL_NOTIFIEROBJ_ALLOC)
	{
		struct drm_nouveau_notifierobj_alloc *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_NOTIFIEROBJ_ALLOC%s post, channel: %d, handle: 0x%0x, size: %d, offset: %d%s\n",
					colors->rname, colors->reset, data->channel, data->handle,
					data->size, data->offset, ret_err(ret, err));

		gpu_object_add(fd, data->channel, data->channel, data->handle, 0);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GPUOBJ_FREE)
	{
		struct drm_nouveau_gpuobj_free *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_NOUVEAU_GPUOBJ_FREE%s, channel: %d, handle: 0x%0x%s\n",
					colors->rname, colors->reset, data->channel, data->handle,
					ret_err(ret, err));

		gpu_object_destroy(gpu_object_find(data->channel, data->handle));
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_NEW)
	{
		struct drm_nouveau_gem_new *g = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_NOUVEAU_GEM_NEW%s post, ", colors->rname, colors->reset);
			dump_drm_nouveau_gem_new(g);
			mmt_log_cont("%s\n", ret_err(ret, err));
		}

		drm_nouveau_gem_new(fd, g->channel_hint, g->channel_hint, &g->info);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_PUSHBUF)
	{
		struct drm_nouveau_gem_pushbuf *data = ioctl_data;

		struct mmt_buf *buffers = find_ptr(data->buffers, args, argc);
		struct mmt_buf *push = find_ptr(data->push, args, argc);
		struct mmt_buf *relocs = find_ptr(data->relocs, args, argc);

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_GEM_PUSHBUF%s post, channel: %d, nr_buffers: %s%d%s, buffers: 0x%" PRIx64 ", nr_relocs: %s%d%s, relocs: 0x%" PRIx64 ", nr_push: %s%d%s, push: 0x%" PRIx64 ", suffix0: 0x%x, suffix1: 0x%x, vram_available: %" PRIu64 ", gart_available: %" PRIu64 "%s\n",
					colors->rname, colors->reset, data->channel, colors->num,
					data->nr_buffers, colors->reset, data->buffers, colors->num,
					data->nr_relocs, colors->reset,data->relocs, colors->num,
					data->nr_push, colors->reset, data->push, data->suffix0,
					data->suffix1, data->vram_available, data->gart_available,
					ret_err(ret, err));

		if (buffers || push || relocs)
			demmt_nouveau_decode_gem_pushbuf_data(data->nr_buffers, (void *)buffers->data,
					data->nr_push, (void *)push->data, data->nr_relocs, (void *)relocs->data);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_CPU_PREP)
	{
		struct drm_nouveau_gem_cpu_prep *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_NOUVEAU_GEM_CPU_PREP%s, handle: %d, flags: 0x%0x%s\n",
					colors->rname, colors->reset, data->handle, data->flags,
					ret_err(ret, err));
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_CPU_FINI)
	{
		struct drm_nouveau_gem_cpu_fini *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_NOUVEAU_GEM_CPU_FINI%s, handle: %d%s\n", colors->rname,
					colors->reset, data->handle, ret_err(ret, err));
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_INFO)
	{
		struct drm_nouveau_gem_info *data = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_NOUVEAU_GEM_INFO%s post, ", colors->rname, colors->reset);
			dump_drm_nouveau_gem_info(data);
			mmt_log_cont("%s\n", ret_err(ret, err));
		}

		struct gpu_object *tmp, *dev = NULL, *obj = NULL;
		for (tmp = gpu_objects; tmp != NULL; tmp = tmp->next)
		{
			if (tmp->class_ == NVRM_DEVICE_0 && tmp->fd == fd)
			{
				dev = tmp;

				struct gpu_object *tmpobj = gpu_object_find(tmp->cid, data->handle);
				if (tmpobj && obj)
				{
					mmt_error("can't uniquely determine object, assuming it's the first one%s\n", "");
					break;
				}
				obj = tmpobj;
			}
		}

		if (!dev)
			mmt_error("can't find matching device object%s\n", "");
		else if (obj)
			mmt_error("FIXME: DRM_NOUVEAU_GEM_INFO on known object%s\n", "");
		else
			drm_nouveau_gem_new(fd, dev->cid, dev->handle, data);
	}
	else if (id == DRM_IOCTL_VERSION64)
	{
		struct drm_version64 *data = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_IOCTL_VERSION64%s, version: %s%d.%d.%d%s, name_addr: 0x%"PRIx64", name_len: %"PRIu64", date_addr: 0x%"PRIx64", date_len: %"PRIu64", desc_addr: 0x%"PRIx64", desc_len: %"PRIu64"%s\n",
					colors->rname, colors->reset, colors->eval, data->version_major,
					data->version_minor, data->version_patchlevel, colors->reset,
					data->name, data->name_len, data->date, data->date_len,
					data->desc, data->desc_len, ret_err(ret, err));

			struct mmt_buf *b = NULL;
			b = find_ptr((uint64_t)(uintptr_t)data->name, args, argc);
			if (b)
				dump_mmt_buf_as_text(b, "name");

			b = find_ptr((uint64_t)(uintptr_t)data->date, args, argc);
			if (b)
				dump_mmt_buf_as_text(b, "date");

			b = find_ptr((uint64_t)(uintptr_t)data->desc, args, argc);
			if (b)
				dump_mmt_buf_as_text(b, "desc");
		}
	}
	else if (id == DRM_IOCTL_VERSION32)
	{
		struct drm_version32 *data = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_IOCTL_VERSION32%s, version: %s%d.%d.%d%s, name_addr: 0x%x, name_len: %d, date_addr: 0x%x, date_len: %d, desc_addr: 0x%x, desc_len: %d%s\n",
					colors->rname, colors->reset, colors->eval, data->version_major,
					data->version_minor, data->version_patchlevel, colors->reset,
					data->name, data->name_len, data->date, data->date_len,
					data->desc, data->desc_len, ret_err(ret, err));

			struct mmt_buf *b = NULL;
			b = find_ptr((uint64_t)(uintptr_t)data->name, args, argc);
			if (b)
				dump_mmt_buf_as_text(b, "name");

			b = find_ptr((uint64_t)(uintptr_t)data->date, args, argc);
			if (b)
				dump_mmt_buf_as_text(b, "date");

			b = find_ptr((uint64_t)(uintptr_t)data->desc, args, argc);
			if (b)
				dump_mmt_buf_as_text(b, "desc");
		}
	}
	else if (id == DRM_IOCTL_GET_MAGIC)
	{
		struct drm_auth *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_GET_MAGIC%s, magic: 0x%08x%s\n", colors->rname,
					colors->reset, data->magic, ret_err(ret, err));
	}
	else if (id == DRM_IOCTL_GEM_CLOSE)
	{
		struct drm_gem_close *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_IOCTL_GEM_CLOSE%s, handle: %d%s\n", colors->rname,
					colors->reset, data->handle, ret_err(ret, err));
		struct gpu_object *obj = gpu_object_find(0, data->handle); // won't work for objects allocated by GEM_OPEN
		if (obj)
			gpu_object_destroy(obj);
	}
	else if (id == DRM_IOCTL_GEM_OPEN)
	{
		struct drm_gem_open *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_GEM_OPEN%s post, name: %s%d%s, handle: %s%d%s, size: %llu%s\n",
					colors->rname, colors->reset, colors->eval, data->name,
					colors->reset, colors->num, data->handle, colors->reset,
					data->size, ret_err(ret, err));
	}
	else if (id == DRM_IOCTL_GET_CAP)
	{
		struct drm_get_cap *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_GET_CAP%s, capability: %s%llu%s, value: %s%llu%s%s\n",
					colors->rname, colors->reset, colors->iname, data->capability,
					colors->reset, colors->num, data->value, colors->reset,
					ret_err(ret, err));
	}
	else if (id == DRM_IOCTL_SET_VERSION)
	{
		struct drm_set_version *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_SET_VERSION%s post, di_major: %2d, di_minor: %2d, dd_major: %2d, dd_minor: %2d\n",
					colors->rname, colors->reset, data->drm_di_major,
					data->drm_di_minor, data->drm_dd_major, data->drm_dd_minor);
	}
	else if (id == DRM_IOCTL_MODE_GETRESOURCES)
	{
		struct drm_mode_card_res *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_MODE_GETRESOURCES%s post, fb_id_ptr: %p, crtc_id_ptr: %p, connector_id_ptr: %p, "
					"encoder_id_ptr: %p, count_fbs: %d, count_crtcs: %d, count_connectors: %d, count_encoders: %d, "
					"min_width: %d, max_width: %4d, min_height: %d, max_height: %4d\n", colors->rname,
					colors->reset,
					(void *)(uintptr_t)data->fb_id_ptr,
					(void *)(uintptr_t)data->crtc_id_ptr,
					(void *)(uintptr_t)data->connector_id_ptr,
					(void *)(uintptr_t)data->encoder_id_ptr,
					data->count_fbs, data->count_crtcs, data->count_connectors,
					data->count_encoders, data->min_width, data->max_width,
					data->min_height, data->max_height);
	}
	else if (id == DRM_IOCTL_SET_MASTER)
	{
		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_SET_MASTER%s\n", colors->rname, colors->reset);
	}
	else if (id == DRM_IOCTL_DROP_MASTER)
	{
		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_DROP_MASTER%s\n", colors->rname, colors->reset);
	}
	else if (id == DRM_IOCTL_AUTH_MAGIC)
	{
		struct drm_auth *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_AUTH_MAGIC%s, magic: 0x%x\n", colors->rname, colors->reset, data->magic);
	}
	else if (id == DRM_IOCTL_GEM_FLINK)
	{
		struct drm_gem_flink *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_GEM_FLINK%s, handle: 0x%x, name: 0x%x\n",
					colors->rname, colors->reset, data->handle, data->name);
	}
	else
	{
		mmt_log("%sunknown drm ioctl%s %x\n", colors->err, colors->reset, nr);
		return 1;
	}

	return 0;
}